

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O3

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<chaiscript::Type_Info>
          (Object_Data *this,shared_ptr<chaiscript::Type_Info> *obj,bool t_return_value)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar5;
  
  peVar1 = (obj->super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  puVar3 = (undefined8 *)operator_new(0x20);
  p_Var2 = (obj->super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (obj->super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (obj->super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar3[1] = &std::shared_ptr<chaiscript::Type_Info>::typeinfo;
  *puVar3 = &PTR__Data_Impl_003f9c08;
  puVar3[2] = peVar1;
  puVar3[3] = p_Var2;
  *(undefined8 *)this = 0;
  puVar4 = (undefined8 *)operator_new(0x50);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_003f78d8;
  puVar4[2] = &Type_Info::typeinfo;
  puVar4[3] = &Type_Info::typeinfo;
  *(undefined4 *)(puVar4 + 4) = 0;
  puVar4[5] = puVar3;
  puVar4[6] = peVar1;
  puVar4[7] = peVar1;
  puVar4[8] = 0;
  *(undefined1 *)(puVar4 + 9) = 0;
  *(bool *)((long)puVar4 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar4;
  *(undefined8 **)this = puVar4 + 2;
  sVar5.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&Type_Info::typeinfo;
  sVar5.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar5.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::shared_ptr<T> &&obj, bool t_return_value) {
        auto ptr = obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), false, ptr, t_return_value);
      }